

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::mask_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          Image *mask)

{
  size_t sVar1;
  runtime_error *this_00;
  uint64_t local_78;
  uint64_t a;
  uint64_t b;
  uint64_t g;
  uint64_t r;
  ssize_t xx;
  ssize_t yy;
  size_t local_38;
  ssize_t h_local;
  ssize_t w_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *source_local;
  Image *this_local;
  
  local_38 = h;
  h_local = w;
  w_local = y;
  y_local = x;
  x_local = (ssize_t)source;
  source_local = this;
  if (w < 0) {
    h_local = get_width(source);
  }
  if ((long)local_38 < 0) {
    local_38 = get_height((Image *)x_local);
  }
  sVar1 = get_width(mask);
  if (((ulong)h_local <= sVar1) && (sVar1 = get_height(mask), local_38 <= sVar1)) {
    clamp_blit_dimensions
              (this,(Image *)x_local,&y_local,&w_local,&h_local,(ssize_t *)&local_38,&sx,&sy);
    for (xx = 0; xx < (long)local_38; xx = xx + 1) {
      for (r = 0; (long)r < h_local; r = r + 1) {
        read_pixel(mask,sx + r,sy + xx,&g,&b,&a,(uint64_t *)0x0);
        if (((g != 0xff) || (b != 0xff)) || (a != 0xff)) {
          read_pixel((Image *)x_local,sx + r,sy + xx,&g,&b,&a,&local_78);
          write_pixel(this,y_local + r,w_local + xx,g,b,a,local_78);
        }
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"mask is too small to cover copied area");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Image::mask_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, const Image& mask) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  // The mask image must cover the entire area to be blitted, but it does NOT
  // have to cover the entire destination or source image. The mask is indexed
  // in source-space, though, so its upper-left corner must be aligned with the
  // source image's upper-left corner.
  if ((mask.get_width() < static_cast<size_t>(w)) ||
      (mask.get_height() < static_cast<size_t>(h))) {
    throw runtime_error("mask is too small to cover copied area");
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (ssize_t yy = 0; yy < h; yy++) {
    for (ssize_t xx = 0; xx < w; xx++) {
      uint64_t r, g, b, a;
      mask.read_pixel(sx + xx, sy + yy, &r, &g, &b);
      if (r == 0xFF && g == 0xFF && b == 0xFF) {
        continue;
      }
      source.read_pixel(sx + xx, sy + yy, &r, &g, &b, &a);
      this->write_pixel(x + xx, y + yy, r, g, b, a);
    }
  }
}